

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

UCollationResult __thiscall
icu_63::RuleBasedCollator::compare
          (RuleBasedCollator *this,UCharIterator *left,UCharIterator *right,UErrorCode *errorCode)

{
  Normalizer2Impl *nfcImpl;
  UBool UVar1;
  char cVar2;
  int c;
  int c_00;
  UChar32 c_01;
  UCollationResult UVar3;
  int startIndex;
  byte numeric;
  UIterCollationIterator rightIter;
  UIterCollationIterator leftIter;
  
  UVar3 = UCOL_EQUAL;
  if ((left != right) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    numeric = (byte)this->settings->options >> 1 & 1;
    startIndex = 0;
    while( true ) {
      c = (*(code *)left->next)(left);
      c_00 = (*(code *)right->next)(right);
      if (c != c_00) break;
      if (c < 0) {
        return UCOL_EQUAL;
      }
      startIndex = startIndex + 1;
    }
    if (-1 < c) {
      (*(code *)left->previous)(left);
    }
    if (-1 < c_00) {
      (*(code *)right->previous)(right);
    }
    if (startIndex == 0) {
      startIndex = 0;
    }
    else {
      if ((-1 < c) && (UVar1 = CollationData::isUnsafeBackward(this->data,c,numeric), UVar1 != '\0')
         ) goto LAB_002267a0;
      if (-1 < c_00) {
        cVar2 = CollationData::isUnsafeBackward(this->data,c_00,numeric);
        while (cVar2 != '\0') {
LAB_002267a0:
          c_01 = (*(code *)left->previous)(left);
          (*(code *)right->previous)(right);
          if (startIndex < 2) {
            startIndex = 0;
            break;
          }
          startIndex = startIndex + -1;
          cVar2 = CollationData::isUnsafeBackward(this->data,c_01,numeric);
        }
      }
    }
    if ((this->settings->options & 1) == 0) {
      UIterCollationIterator::UIterCollationIterator(&leftIter,this->data,numeric,left);
      UIterCollationIterator::UIterCollationIterator(&rightIter,this->data,numeric,right);
      UVar3 = CollationCompare::compareUpToQuaternary
                        (&leftIter.super_CollationIterator,&rightIter.super_CollationIterator,
                         this->settings,errorCode);
      UIterCollationIterator::~UIterCollationIterator(&rightIter);
      UIterCollationIterator::~UIterCollationIterator(&leftIter);
    }
    else {
      FCDUIterCollationIterator::FCDUIterCollationIterator
                ((FCDUIterCollationIterator *)&leftIter,this->data,numeric,left,startIndex);
      FCDUIterCollationIterator::FCDUIterCollationIterator
                ((FCDUIterCollationIterator *)&rightIter,this->data,numeric,right,startIndex);
      UVar3 = CollationCompare::compareUpToQuaternary
                        (&leftIter.super_CollationIterator,&rightIter.super_CollationIterator,
                         this->settings,errorCode);
      FCDUIterCollationIterator::~FCDUIterCollationIterator((FCDUIterCollationIterator *)&rightIter)
      ;
      FCDUIterCollationIterator::~FCDUIterCollationIterator((FCDUIterCollationIterator *)&leftIter);
    }
    if (((UVar3 == UCOL_EQUAL) && (UVar3 = UCOL_EQUAL, 0xefff < this->settings->options)) &&
       (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
      (*left->move)(left,startIndex,UITER_ZERO);
      (*right->move)(right,startIndex,UITER_ZERO);
      nfcImpl = this->data->nfcImpl;
      if ((this->settings->options & 1) == 0) {
        leftIter.super_CollationIterator.ceBuffer.length = -1;
        leftIter.super_CollationIterator.ceBuffer._4_4_ = 0;
        leftIter.super_CollationIterator.super_UObject._vptr_UObject =
             (_func_int **)&PTR__UObject_003ca6a8;
        rightIter.super_CollationIterator.ceBuffer.length = -1;
        rightIter.super_CollationIterator.ceBuffer._4_4_ = 0;
        rightIter.super_CollationIterator.super_UObject._vptr_UObject =
             (_func_int **)&PTR__UObject_003ca6a8;
        rightIter.super_CollationIterator.ceBuffer.buffer.ptr = (long *)right;
        leftIter.super_CollationIterator.ceBuffer.buffer.ptr = (long *)left;
        UVar3 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)&leftIter,(NFDIterator *)&rightIter);
        UObject::~UObject((UObject *)&rightIter);
        UObject::~UObject((UObject *)&leftIter);
      }
      else {
        anon_unknown_16::FCDUIterNFDIterator::FCDUIterNFDIterator
                  ((FCDUIterNFDIterator *)&leftIter,this->data,left,startIndex);
        anon_unknown_16::FCDUIterNFDIterator::FCDUIterNFDIterator
                  ((FCDUIterNFDIterator *)&rightIter,this->data,right,startIndex);
        UVar3 = anon_unknown_16::compareNFDIter
                          (nfcImpl,(NFDIterator *)&leftIter,(NFDIterator *)&rightIter);
        anon_unknown_16::FCDUIterNFDIterator::~FCDUIterNFDIterator
                  ((FCDUIterNFDIterator *)&rightIter);
        anon_unknown_16::FCDUIterNFDIterator::~FCDUIterNFDIterator((FCDUIterNFDIterator *)&leftIter)
        ;
      }
    }
  }
  return UVar3;
}

Assistant:

UCollationResult
RuleBasedCollator::compare(UCharIterator &left, UCharIterator &right,
                           UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode) || &left == &right) { return UCOL_EQUAL; }
    UBool numeric = settings->isNumeric();

    // Identical-prefix test.
    int32_t equalPrefixLength = 0;
    {
        UChar32 leftUnit;
        UChar32 rightUnit;
        while((leftUnit = left.next(&left)) == (rightUnit = right.next(&right))) {
            if(leftUnit < 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }

        // Back out the code units that differed, for the real collation comparison.
        if(leftUnit >= 0) { left.previous(&left); }
        if(rightUnit >= 0) { right.previous(&right); }

        if(equalPrefixLength > 0) {
            if((leftUnit >= 0 && data->isUnsafeBackward(leftUnit, numeric)) ||
                    (rightUnit >= 0 && data->isUnsafeBackward(rightUnit, numeric))) {
                // Identical prefix: Back up to the start of a contraction or reordering sequence.
                do {
                    --equalPrefixLength;
                    leftUnit = left.previous(&left);
                    right.previous(&right);
                } while(equalPrefixLength > 0 && data->isUnsafeBackward(leftUnit, numeric));
            }
            // See the notes in the UTF-16 version.
        }
    }

    UCollationResult result;
    if(settings->dontCheckFCD()) {
        UIterCollationIterator leftIter(data, numeric, left);
        UIterCollationIterator rightIter(data, numeric, right);
        result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
    } else {
        FCDUIterCollationIterator leftIter(data, numeric, left, equalPrefixLength);
        FCDUIterCollationIterator rightIter(data, numeric, right, equalPrefixLength);
        result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return result;
    }

    // Compare identical level.
    left.move(&left, equalPrefixLength, UITER_ZERO);
    right.move(&right, equalPrefixLength, UITER_ZERO);
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    if(settings->dontCheckFCD()) {
        UIterNFDIterator leftIter(left);
        UIterNFDIterator rightIter(right);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUIterNFDIterator leftIter(data, left, equalPrefixLength);
        FCDUIterNFDIterator rightIter(data, right, equalPrefixLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}